

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

void __thiscall
testing::internal::anon_unknown_31::FailureTest::FailureTest
          (FailureTest *this,CodeLocation *loc,string *error_message,bool as_error)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  undefined8 uVar4;
  
  Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__FailureTest_00159570;
  (this->loc_).file._M_dataplus._M_p = (pointer)&(this->loc_).file.field_2;
  pcVar3 = (loc->file)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->loc_,pcVar3,pcVar3 + (loc->file)._M_string_length);
  (this->loc_).line = loc->line;
  paVar1 = &(this->error_message_).field_2;
  (this->error_message_)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (error_message->_M_dataplus)._M_p;
  paVar2 = &error_message->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&error_message->field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->error_message_).field_2 + 8) = uVar4;
  }
  else {
    (this->error_message_)._M_dataplus._M_p = pcVar3;
    (this->error_message_).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->error_message_)._M_string_length = error_message->_M_string_length;
  (error_message->_M_dataplus)._M_p = (pointer)paVar2;
  error_message->_M_string_length = 0;
  (error_message->field_2)._M_local_buf[0] = '\0';
  this->as_error_ = false;
  return;
}

Assistant:

explicit FailureTest(const CodeLocation& loc, std::string error_message,
                       bool as_error)
      : loc_(loc),
        error_message_(std::move(error_message)),
        as_error_(as_error) {}